

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall
clipp::documentation::documentation
          (documentation *this,group *cli,doc_formatting *fmt,filter_function *filter)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  
  this->cli_ = cli;
  doc_formatting::doc_formatting(&this->fmt_,fmt);
  doc_formatting::doc_formatting(&this->usgFmt_,fmt);
  *(undefined8 *)&(this->filter_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->filter_).super__Function_base._M_functor + 8) = 0;
  (this->filter_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->filter_)._M_invoker = filter->_M_invoker;
  if ((filter->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(filter->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->filter_).super__Function_base._M_functor =
         *(undefined8 *)&(filter->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->filter_).super__Function_base._M_functor + 8) = uVar2;
    (this->filter_).super__Function_base._M_manager = (filter->super__Function_base)._M_manager;
    (filter->super__Function_base)._M_manager = (_Manager_type)0x0;
    filter->_M_invoker = (_Invoker_type)0x0;
  }
  iVar1 = (this->usgFmt_).maxAltInDocs_;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  (this->usgFmt_).maxAltInUsage_ = iVar3;
  return;
}

Assistant:

documentation(const group& cli,
                  const doc_formatting& fmt = doc_formatting{},
                  filter_function filter = param_filter{})
    :
        cli_(cli), fmt_{fmt}, usgFmt_{fmt}, filter_{std::move(filter)}
    {
        //necessary, because we re-use "usage_lines" to generate
        //labels for documented groups
        usgFmt_.max_flags_per_param_in_usage(
            usgFmt_.max_flags_per_param_in_doc());
    }